

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_buffer.c
# Opt level: O1

void test_init_read_buffer(void)

{
  UnityAssertEqualNumber
            (0,0,"Read buffer was not initialized correctly!",0x35,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (4,4,"Available space not initialized correctly!",0x36,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,0,"Unread bytes was not initialized correctly!",0x37,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (4,4,"Size of read buffer not initialized correctly!",0x39,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_init_read_buffer(void)
{
	uint32_t buffer;
	struct cio_read_buffer rb;
	enum cio_error err = cio_read_buffer_init(&rb, &buffer, sizeof(buffer));
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Read buffer was not initialized correctly!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(buffer), cio_read_buffer_space_available(&rb), "Available space not initialized correctly!");
	TEST_ASSERT_EQUAL_MESSAGE(0, cio_read_buffer_unread_bytes(&rb), "Unread bytes was not initialized correctly!");

	TEST_ASSERT_EQUAL_MESSAGE(sizeof(buffer), cio_read_buffer_size(&rb), "Size of read buffer not initialized correctly!");
}